

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateEqualsCode
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  JavaType JVar1;
  LogMessage *other;
  char *text;
  LogFinisher local_49;
  LogMessage local_48;
  
  JVar1 = GetJavaType(this->descriptor_);
  switch(JVar1) {
  case JAVATYPE_INT:
  case JAVATYPE_LONG:
  case JAVATYPE_BOOLEAN:
    text = "result = result && (get$capitalized_name$()\n    == other.get$capitalized_name$());\n";
    break;
  case JAVATYPE_FLOAT:
    text = 
    "result = result && (\n    java.lang.Float.floatToIntBits(get$capitalized_name$())\n    == java.lang.Float.floatToIntBits(\n        other.get$capitalized_name$()));\n"
    ;
    break;
  case JAVATYPE_DOUBLE:
    text = 
    "result = result && (\n    java.lang.Double.doubleToLongBits(get$capitalized_name$())\n    == java.lang.Double.doubleToLongBits(\n        other.get$capitalized_name$()));\n"
    ;
    break;
  case JAVATYPE_STRING:
  case JAVATYPE_BYTES:
    text = 
    "result = result && get$capitalized_name$()\n    .equals(other.get$capitalized_name$());\n";
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_primitive_field_lite.cc"
               ,0x195);
    other = internal::LogMessage::operator<<(&local_48,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
    return;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::
GenerateEqualsCode(io::Printer* printer) const {
  switch (GetJavaType(descriptor_)) {
    case JAVATYPE_INT:
    case JAVATYPE_LONG:
    case JAVATYPE_BOOLEAN:
      printer->Print(variables_,
        "result = result && (get$capitalized_name$()\n"
        "    == other.get$capitalized_name$());\n");
      break;

    case JAVATYPE_FLOAT:
      printer->Print(variables_,
        "result = result && (\n"
        "    java.lang.Float.floatToIntBits(get$capitalized_name$())\n"
        "    == java.lang.Float.floatToIntBits(\n"
        "        other.get$capitalized_name$()));\n");
      break;

    case JAVATYPE_DOUBLE:
      printer->Print(variables_,
        "result = result && (\n"
        "    java.lang.Double.doubleToLongBits(get$capitalized_name$())\n"
        "    == java.lang.Double.doubleToLongBits(\n"
        "        other.get$capitalized_name$()));\n");
      break;

    case JAVATYPE_STRING:
    case JAVATYPE_BYTES:
      printer->Print(variables_,
        "result = result && get$capitalized_name$()\n"
        "    .equals(other.get$capitalized_name$());\n");
      break;

    case JAVATYPE_ENUM:
    case JAVATYPE_MESSAGE:
    default:
      GOOGLE_LOG(FATAL) << "Can't get here.";
      break;
  }
}